

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

json_t * json_object_deep_copy(json_t *object,hashtable_t *parents)

{
  int iVar1;
  char *key_00;
  json_t *pjVar2;
  json_t *value;
  char *key;
  size_t loop_key_len;
  char loop_key [19];
  void *iter;
  json_t *result;
  hashtable_t *parents_local;
  json_t *object_local;
  
  iVar1 = jsonp_loop_check(parents,object,(char *)&loop_key_len,0x13,(size_t *)&key);
  if (iVar1 == 0) {
    iter = json_object();
    if ((json_t *)iter != (json_t *)0x0) {
      for (register0x00000000 = json_object_iter(object); stack0xffffffffffffffd0 != (void *)0x0;
          register0x00000000 = json_object_iter_next(object,stack0xffffffffffffffd0)) {
        key_00 = json_object_iter_key(stack0xffffffffffffffd0);
        pjVar2 = json_object_iter_value(stack0xffffffffffffffd0);
        pjVar2 = do_deep_copy(pjVar2,parents);
        iVar1 = json_object_set_new_nocheck((json_t *)iter,key_00,pjVar2);
        if (iVar1 != 0) {
          json_decref((json_t *)iter);
          iter = (void *)0x0;
          break;
        }
      }
    }
    hashtable_del(parents,(char *)&loop_key_len,(size_t)key);
    object_local = (json_t *)iter;
  }
  else {
    object_local = (json_t *)0x0;
  }
  return object_local;
}

Assistant:

static json_t *json_object_deep_copy(const json_t *object, hashtable_t *parents) {
    json_t *result;
    void *iter;
    char loop_key[LOOP_KEY_LEN];
    size_t loop_key_len;

    if (jsonp_loop_check(parents, object, loop_key, sizeof(loop_key), &loop_key_len))
        return NULL;

    result = json_object();
    if (!result)
        goto out;

    /* Cannot use json_object_foreach because object has to be cast
       non-const */
    iter = json_object_iter((json_t *) object);
    while (iter) {
        const char *key;
        const json_t *value;
        key = json_object_iter_key(iter);
        value = json_object_iter_value(iter);

        if (json_object_set_new_nocheck(result, key, do_deep_copy(value, parents))) {
            json_decref(result);
            result = NULL;
            break;
        }
        iter = json_object_iter_next((json_t *) object, iter);
    }

    out:
    hashtable_del(parents, loop_key, loop_key_len);

    return result;
}